

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::CodeHolder::resolveUnresolvedLinks(CodeHolder *this)

{
  ZoneAllocator *allocator;
  CodeBuffer *cb;
  int iVar1;
  uint uVar2;
  OffsetFormat OVar3;
  long lVar4;
  OffsetFormat OVar5;
  bool bVar6;
  undefined1 uVar7;
  Error EVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint *puVar11;
  ExpressionValueType *pEVar12;
  Arch *pAVar13;
  Value VVar14;
  ulong uVar15;
  Value VVar16;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long lVar17;
  ulong uVar18;
  ExpressionValueType *pEVar19;
  Section *pSVar20;
  OffsetFormat *unaff_RBP;
  OffsetFormat *pOVar21;
  ulong uVar22;
  Arch *in_RSI;
  Value self;
  CodeHolder *pCVar23;
  CodeHolder *pCVar24;
  ZoneAllocator *pZVar25;
  CodeHolder *self_00;
  uint uVar26;
  CodeHolder *pCVar27;
  long lVar28;
  long *plVar29;
  OffsetFormat *format;
  undefined8 *puVar30;
  Value *pVVar31;
  undefined8 unaff_R14;
  long *plVar32;
  undefined8 *puVar33;
  bool bVar34;
  Value aVStack_190 [2];
  Value VStack_180;
  Value VStack_178;
  Value VStack_170;
  Section *pSStack_168;
  CodeHolder *pCStack_160;
  OffsetFormat *pOStack_158;
  CodeHolder *pCStack_150;
  Value VStack_148;
  code *pcStack_140;
  Arch AStack_131;
  ulong uStack_130;
  Section *pSStack_128;
  Value VStack_120;
  uint8_t *puStack_118;
  Value VStack_110;
  ulong uStack_108;
  Arch *pAStack_100;
  CodeHolder *pCStack_f8;
  OffsetFormat *pOStack_f0;
  CodeHolder *pCStack_e8;
  ZoneAllocator *pZStack_e0;
  ulong uStack_d8;
  undefined8 uStack_d0;
  size_t sStack_c0;
  Arch *pAStack_b8;
  long *plStack_b0;
  CodeHolder *pCStack_a8;
  long lStack_a0;
  ulong uStack_98;
  Error EStack_84;
  long lStack_80;
  CodeHolder *pCStack_78;
  long *plStack_70;
  OffsetFormat *pOStack_68;
  undefined8 uStack_60;
  long *plStack_58;
  OffsetFormat *pOStack_50;
  long *local_48;
  long *local_40;
  Arch *local_38;
  
  format = (OffsetFormat *)0x0;
  if ((this->_unresolvedLinkCount != 0) && ((ulong)*(uint *)&this->field_0x100 != 0)) {
    local_40 = *(long **)&this->_labelEntries;
    local_48 = local_40 + *(uint *)&this->field_0x100;
    format = (OffsetFormat *)0x0;
    pCVar23 = this;
    do {
      lVar17 = *local_40;
      if ((*(long *)(lVar17 + 0x20) != 0) && (*(long **)(lVar17 + 0x28) != (long *)0x0)) {
        plVar29 = (long *)(lVar17 + 0x28);
        uVar18 = *(ulong *)(*(long *)(lVar17 + 0x20) + 0x10);
        bVar34 = CARRY8(uVar18,*(ulong *)(lVar17 + 0x18));
        pAVar13 = (Arch *)(uVar18 + *(ulong *)(lVar17 + 0x18));
        unaff_R14 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar34);
        plVar32 = *(long **)(lVar17 + 0x28);
        local_38 = pAVar13;
        do {
          pOVar21 = format;
          if (*(int *)((long)plVar32 + 0xc) != -1) goto LAB_00118bc5;
          if (*(uint *)&this->field_0xe0 <= *(uint *)(plVar32 + 1)) {
            pOStack_50 = (OffsetFormat *)0x118c04;
            resolveUnresolvedLinks();
LAB_00118c04:
            pOStack_50 = (OffsetFormat *)0x118c09;
            resolveUnresolvedLinks();
LAB_00118c09:
            pOStack_50 = (OffsetFormat *)0x118c0e;
            resolveUnresolvedLinks();
LAB_00118c0e:
            pOStack_50 = (OffsetFormat *)0x118c13;
            resolveUnresolvedLinks();
            EStack_84 = 0xc;
            if (*(uint *)&pCVar23->field_0x100 <= *(uint *)(in_RSI + 4)) {
              return 0xc;
            }
            lVar17 = *(long *)(*(long *)&pCVar23->_labelEntries + (ulong)*(uint *)(in_RSI + 4) * 8);
            if (lVar17 == 0) {
              return 0xc;
            }
            uVar18 = (ulong)extraout_EDX;
            if (*(uint *)&pCVar23->field_0xe0 < extraout_EDX) {
              return 0x13;
            }
            if (*(long *)(lVar17 + 0x20) != 0) {
              return 0xe;
            }
            pCStack_78 = this;
            plStack_70 = plVar29;
            pOStack_68 = format;
            uStack_60 = unaff_R14;
            plStack_58 = plVar32;
            pOStack_50 = unaff_RBP;
            if (extraout_EDX < *(uint *)&pCVar23->field_0xe0) {
              lStack_80 = *(long *)(*(long *)&pCVar23->_sections + uVar18 * 8);
              *(long *)(lVar17 + 0x20) = lStack_80;
              *(Arch **)(lVar17 + 0x18) = pAVar13;
              if (*(undefined8 **)(lVar17 + 0x28) == (undefined8 *)0x0) {
                return 0;
              }
              EStack_84 = 0;
              puVar10 = *(undefined8 **)(lVar17 + 0x28);
              puVar33 = (undefined8 *)(lVar17 + 0x28);
              goto LAB_00118cb0;
            }
            uStack_98 = 0x118daf;
            pCVar24 = pCVar23;
            bindLabel();
            uVar22 = (ulong)extraout_EDX_00;
            allocator = &pCVar24->_allocator;
            uVar26 = *(uint *)&pCVar24->field_0x110;
            pAStack_b8 = pAVar13;
            plStack_b0 = plVar29;
            pCStack_a8 = pCVar23;
            lStack_a0 = lVar17;
            uStack_98 = uVar18;
            if (*(uint *)&pCVar24->field_0x114 == uVar26) {
              uStack_d0 = 0x118df1;
              EVar8 = ZoneVectorBase::_grow((ZoneVectorBase *)&pCVar24->_relocations,allocator,8,1);
              if (EVar8 != 0) {
                return EVar8;
              }
              uVar26 = *(uint *)&pCVar24->field_0x110;
            }
            pCVar23 = (CodeHolder *)(ulong)uVar26;
            if (uVar26 == 0xffffffff) {
              EVar8 = 0x16;
            }
            else {
              if (*(long *)allocator == 0) {
                uStack_d0 = 0x118e6d;
                newRelocEntry();
              }
              else {
                uStack_d0 = 0x118e1a;
                pZVar25 = allocator;
                puVar11 = (uint *)ZoneAllocator::_allocZeroed(allocator,0x28,&sStack_c0);
                if (puVar11 != (uint *)0x0) {
                  *puVar11 = uVar26;
                  puVar11[1] = extraout_EDX_00;
                  puVar11[4] = 0xffffffff;
                  puVar11[5] = 0xffffffff;
                  if (*(uint *)&pCVar24->field_0x110 < *(uint *)&pCVar24->field_0x114) {
                    *(uint **)(*(long *)&pCVar24->_relocations +
                              (ulong)*(uint *)&pCVar24->field_0x110 * 8) = puVar11;
                    *(int *)&pCVar24->field_0x110 = *(int *)&pCVar24->field_0x110 + 1;
                    *(uint **)in_RSI = puVar11;
                    return 0;
                  }
                  uStack_d0 = 0x118e79;
                  newRelocEntry();
                  if ((ulong)*(uint *)(pZVar25 + 0xf0) == 0) {
                    return 0;
                  }
                  lVar17 = 0;
                  self_00 = (CodeHolder *)0x0;
                  VVar16._0_1_ = kSignedOffset;
                  VVar16._1_1_ = '\0';
                  VVar16._2_1_ = '\0';
                  VVar16._3_1_ = '\0';
                  VVar16._4_1_ = '\0';
                  VVar16._5_1_ = '\0';
                  VVar16._6_1_ = '\0';
                  VVar16._7_1_ = '\0';
                  goto LAB_00118e97;
                }
              }
              EVar8 = 1;
            }
            return EVar8;
          }
          pAVar13 = *(Arch **)&this->_sections;
          lVar17 = *(long *)(pAVar13 + (ulong)*(uint *)(plVar32 + 1) * 8);
          pCVar23 = (CodeHolder *)plVar32[2];
          if (*(CodeHolder **)(lVar17 + 0x50) <= pCVar23) goto LAB_00118c04;
          uVar18 = *(ulong *)(lVar17 + 0x10);
          pAVar13 = &(pCVar23->_environment)._arch + uVar18;
          in_RSI = (Arch *)CONCAT71((int7)((ulong)in_RSI >> 8),
                                    CARRY8(uVar18,(ulong)pCVar23) || bVar34);
          unaff_RBP = (OffsetFormat *)0x30;
          pOVar21 = unaff_RBP;
          if (!CARRY8(uVar18,(ulong)pCVar23) && !bVar34) {
            in_RSI = (Arch *)(ulong)*(byte *)((long)plVar32 + 0x23);
            if ((undefined8 *)((long)*(CodeHolder **)(lVar17 + 0x50) - (long)pCVar23) < in_RSI)
            goto LAB_00118c09;
            in_RSI = local_38 + (plVar32[3] - (long)pAVar13);
            pCVar23 = (CodeHolder *)(&(pCVar23->_environment)._arch + *(long *)(lVar17 + 0x48));
            pOStack_50 = (OffsetFormat *)0x118b9f;
            bVar6 = CodeWriterUtils::writeOffset
                              (pCVar23,(int64_t)in_RSI,(OffsetFormat *)(plVar32 + 4));
            if (!bVar6) goto LAB_00118bc5;
            plVar9 = (long *)*plVar32;
            *plVar29 = (long)plVar9;
            this->_unresolvedLinkCount = this->_unresolvedLinkCount - 1;
            if (*(long *)&this->_allocator != 0) {
              pAVar13 = *(Arch **)&this->field_0x78;
              *plVar32 = (long)pAVar13;
              *(long **)&this->field_0x78 = plVar32;
              goto LAB_00118bce;
            }
            goto LAB_00118c0e;
          }
LAB_00118bc5:
          plVar9 = (long *)*plVar32;
          unaff_RBP = pOVar21;
          plVar29 = plVar32;
          format = pOVar21;
LAB_00118bce:
          plVar32 = plVar9;
        } while (plVar9 != (long *)0x0);
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
  }
  return (Error)format;
LAB_00118cb0:
  puVar30 = puVar10;
  uVar26 = *(uint *)((long)puVar30 + 0xc);
  if ((ulong)uVar26 != 0xffffffff) {
    if (uVar26 < *(uint *)&pCVar23->field_0x110) {
      lVar17 = *(long *)(*(long *)&pCVar23->_relocations + (ulong)uVar26 * 8);
      plVar29 = (long *)(lVar17 + 0x20);
      *plVar29 = (long)(pAVar13 + *plVar29);
      *(uint *)(lVar17 + 0x14) = extraout_EDX;
LAB_00118cd8:
      puVar10 = (undefined8 *)*puVar30;
      *puVar33 = puVar10;
      pCVar23->_unresolvedLinkCount = pCVar23->_unresolvedLinkCount - 1;
      if (*(long *)&pCVar23->_allocator != 0) {
        *puVar30 = *(undefined8 *)&pCVar23->field_0x78;
        *(undefined8 **)&pCVar23->field_0x78 = puVar30;
        puVar30 = puVar33;
        goto LAB_00118d56;
      }
      uStack_98 = 0x118d87;
      bindLabel();
    }
    uStack_98 = 0x118d8c;
    bindLabel();
LAB_00118d8c:
    uStack_98 = 0x118d91;
    bindLabel();
LAB_00118d91:
    uStack_98 = 0x118d96;
    bindLabel();
    return 0x13;
  }
  if (*(uint *)(puVar30 + 1) == extraout_EDX) {
    uVar18 = puVar30[2];
    if (*(ulong *)(lStack_80 + 0x50) <= uVar18) goto LAB_00118d8c;
    if (*(ulong *)(lStack_80 + 0x50) - uVar18 < (ulong)*(byte *)((long)puVar30 + 0x22))
    goto LAB_00118d91;
    uStack_98 = 0x118d40;
    bVar34 = CodeWriterUtils::writeOffset
                       ((void *)(uVar18 + *(long *)(lStack_80 + 0x48)),
                        (int64_t)(pAVar13 + (puVar30[3] - uVar18)),(OffsetFormat *)(puVar30 + 4));
    if (bVar34) goto LAB_00118cd8;
    puVar10 = (undefined8 *)*puVar30;
    EStack_84 = 0x30;
  }
  else {
    puVar10 = (undefined8 *)*puVar30;
  }
LAB_00118d56:
  puVar33 = puVar30;
  if (puVar10 == (undefined8 *)0x0) {
    return EStack_84;
  }
  goto LAB_00118cb0;
LAB_00118e97:
  lVar28 = *(long *)(*(long *)(pZVar25 + 0xe8) + lVar17);
  uVar18 = *(ulong *)(lVar28 + 0x50);
  if (*(ulong *)(lVar28 + 0x50) < *(ulong *)(lVar28 + 0x18)) {
    uVar18 = *(ulong *)(lVar28 + 0x18);
  }
  if (uVar18 != 0) {
    pCVar27 = (CodeHolder *)
              (-(ulong)*(uint *)(lVar28 + 8) & (long)self_00 + ((ulong)*(uint *)(lVar28 + 8) - 1));
    if (pCVar27 < self_00) {
      uStack_d8 = 0x118ef1;
      codeSize();
      if ((OffsetFormat)VVar16.constant == (OffsetFormat)0xffffffffffffffff) goto LAB_0011924f;
      self_00->_baseAddress = (uint64_t)VVar16;
      AStack_131 = (self_00->_environment)._arch;
      pSVar20 = self_00->_addressTableSection;
      VVar14 = VVar16;
      pCVar27 = self_00;
      pAStack_100 = in_RSI;
      pCStack_f8 = pCVar23;
      pOStack_f0 = format;
      pCStack_e8 = pCVar24;
      pZStack_e0 = allocator;
      uStack_d8 = uVar22;
      if (pSVar20 == (Section *)0x0) {
        puStack_118 = (uint8_t *)0x0;
      }
      else {
        cb = &pSVar20->_buffer;
        if ((pSVar20->_buffer)._capacity < pSVar20->_virtualSize) {
          uVar22 = 9;
          if (((pSVar20->_buffer)._flags & kIsFixed) != kNone) goto LAB_00119229;
          pcStack_140 = (code *)0x118f4e;
          VVar14 = (Value)cb;
          EVar8 = CodeHolder_reserveInternal(self_00,cb,pSVar20->_virtualSize);
          uVar22 = (ulong)EVar8;
          if (EVar8 != 0) goto LAB_00119229;
        }
        puStack_118 = cb->_data;
        pCVar23 = (CodeHolder *)cb;
      }
      uStack_130 = 0;
      pSStack_128 = pSVar20;
      VStack_120 = VVar16;
      if ((ulong)*(uint *)&self_00->field_0x110 == 0) goto LAB_001191ea;
      pSVar20 = (Section *)
                ((*(Value *)&self_00->_relocations)->valueType +
                (ulong)*(uint *)&self_00->field_0x110 * 8 + -1);
      uStack_108 = (ulong)(AStack_131 & k32BitMask) ^ 3;
      uStack_130 = 0;
      uVar22 = 0x17;
      VVar16.expression = *(Value *)&self_00->_relocations;
      goto LAB_00118fcd;
    }
    self_00 = (CodeHolder *)(&(pCVar27->_environment)._arch + uVar18);
    VVar16._0_1_ = (OffsetType)VVar16.constant | CARRY8((ulong)pCVar27,uVar18);
    VVar16.constant._1_7_ = 0;
  }
  lVar17 = lVar17 + 8;
  if ((ulong)*(uint *)(pZVar25 + 0xf0) << 3 == lVar17) {
    return -(uint)((OffsetType)VVar16.constant != kSignedOffset) | (uint)self_00;
  }
  goto LAB_00118e97;
LAB_00118fcd:
  do {
    format = *(OffsetFormat **)VVar16.expression;
    iVar1 = *(int *)&format->_valueOffset;
    if (iVar1 != 0) {
      uVar26._0_1_ = format[2]._type;
      uVar26._1_1_ = format[2]._flags;
      uVar26._2_1_ = format[2]._regionSize;
      uVar26._3_1_ = format[2]._valueSize;
      if (*(uint *)&self_00->field_0xe0 <= uVar26) {
        pcStack_140 = (code *)0x11924a;
        relocateToBase();
LAB_0011924a:
        pcStack_140 = (code *)0x11924f;
        relocateToBase();
LAB_0011924f:
        uVar22 = 2;
        goto LAB_00119229;
      }
      lVar17 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar26 * 8);
      uVar2._0_1_ = format[2]._valueOffset;
      uVar2._1_1_ = format[2]._immBitCount;
      uVar2._2_1_ = format[2]._immBitShift;
      uVar2._3_1_ = format[2]._immDiscardLsb;
      if ((ulong)uVar2 == 0xffffffff) {
        lVar28 = 0;
      }
      else {
        if (*(uint *)&self_00->field_0xe0 <= uVar2) goto LAB_0011924a;
        lVar28 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar2 * 8);
      }
      self = (Value)((Value *)(format + 4))->expression;
      OVar3 = format[3];
      if ((((ulong)*(OffsetFormat *)(lVar17 + 0x50) <= (ulong)OVar3) ||
          (pCVar27 = (CodeHolder *)(ulong)format[1]._regionSize,
          (CodeHolder *)((long)*(OffsetFormat *)(lVar17 + 0x50) - (long)OVar3) < pCVar27)) ||
         (4 < iVar1 - 1U)) goto LAB_00119229;
      lVar4 = *(long *)(lVar17 + 0x10);
      pCVar23 = *(CodeHolder **)(lVar17 + 0x48);
      VVar14 = self;
      VStack_110 = self;
      switch(iVar1) {
      case 1:
        pcStack_140 = (code *)0x119072;
        EVar8 = CodeHolder_evaluateExpression
                          ((CodeHolder *)self.expression,(Expression *)&VStack_110,
                           (uint64_t *)&switchD_00119063::switchdataD_0014c3c0);
        VVar14 = VStack_110;
        if (EVar8 != 0) {
          uVar22 = (ulong)EVar8;
          goto LAB_00119229;
        }
        break;
      case 3:
        if (lVar28 == 0) goto LAB_00119229;
        VVar14.expression =
             (Expression *)
             ((self.expression)->valueType + (long)(VStack_120.constant - 1) +
             *(long *)(lVar28 + 0x10));
        break;
      case 4:
        VVar14.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_120.expression)->valueType + (long)pCVar27 + lVar4 + (long)OVar3 + -1));
        if ((AStack_131 & k32BitMask) == kUnknown) {
          if ((long)(int)VVar14.constant != VVar14.constant) {
LAB_0011923e:
            uVar22 = 0x18;
            goto LAB_00119229;
          }
        }
        else {
          VVar14 = (Value)(long)(int)VVar14.constant;
        }
        break;
      case 5:
        if ((format[1]._valueSize != '\x04') ||
           (uVar18 = (ulong)format[1]._valueOffset + (long)OVar3, uVar18 < 2)) goto LAB_00119229;
        VVar14.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_120.expression)->valueType + (long)pCVar27 + lVar4 + (long)OVar3 + -1));
        if ((long)(int)VVar14.constant != VVar14.constant) {
          uVar15 = *(ulong *)&self_00->_addressTableEntries;
          while( true ) {
            if (uVar15 == 0) goto LAB_00119229;
            OVar5 = *(OffsetFormat *)(uVar15 + 0x10);
            uVar26 = (uint)((ulong)OVar5 >= self.constant && OVar5 != (OffsetFormat)self.constant) -
                     (uint)((ulong)OVar5 < self.constant);
            if (uVar26 == 0) break;
            uVar15 = *(ulong *)(uVar15 + (ulong)(uVar26 >> 0x1f) * 8) & 0xfffffffffffffffe;
          }
          if (pSStack_128 == (Section *)0x0) goto LAB_00119260;
          uVar26 = *(uint *)(uVar15 + 0x18);
          if (uVar26 == 0xffffffff) {
            uVar26 = (uint)uStack_130;
            *(uint *)(uVar15 + 0x18) = uVar26;
            uStack_130 = (ulong)(uVar26 + 1);
          }
          lVar17 = (ulong)uVar26 << ((byte)uStack_108 & 0x3f);
          VVar14.expression =
               (Expression *)
               (pSStack_128->_offset +
               (lVar17 - (long)(&(pCVar27->_environment)._arch + (long)OVar3 + lVar4)));
          if ((long)(int)VVar14.constant != VVar14.constant) goto LAB_0011923e;
          uVar7 = 0x15;
          if ((&pCVar23[-1].field_0x157)[uVar18] != -0x18) {
            if ((&pCVar23[-1].field_0x157)[uVar18] != -0x17) goto LAB_00119229;
            uVar7 = 0x25;
          }
          (&pCVar23[-1].field_0x156)[uVar18] = 0xff;
          (&pCVar23[-1].field_0x157)[uVar18] = uVar7;
          *(OffsetFormat *)(puStack_118 + lVar17) = format[4];
        }
      }
      pCVar23 = (CodeHolder *)(&(pCVar23->_environment)._arch + (long)format[3]);
      format = format + 1;
      pcStack_140 = (code *)0x1191d9;
      pCVar27 = pCVar23;
      bVar34 = CodeWriterUtils::writeOffset(pCVar23,VVar14.constant,format);
      if (!bVar34) goto LAB_00119229;
    }
    VVar16.expression = (Expression *)(VVar16.expression)->value;
  } while ((Section *)VVar16.constant != pSVar20);
LAB_001191ea:
  if (*(int *)&self_00->field_0xf0 == 0) {
    pcStack_140 = (code *)0x11925b;
    relocateToBase();
    self = VVar14;
  }
  else {
    uVar22 = 0;
    if (*(Section **)
         (*(long *)&self_00->_sectionsByOrder + (ulong)(*(int *)&self_00->field_0xf0 - 1) * 8) !=
        pSStack_128) {
LAB_00119229:
      return (Error)uVar22;
    }
    self = VVar14;
    if (pSStack_128 != (Section *)0x0) {
      uVar18 = (ulong)(uint)((int)uStack_130 << (AStack_131 & k32BitMask ^ kRISCV32));
      (pSStack_128->_buffer)._size = uVar18;
      pSStack_128->_virtualSize = uVar18;
      goto LAB_00119229;
    }
  }
  pcStack_140 = (code *)0x119260;
  relocateToBase();
LAB_00119260:
  pcStack_140 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar17 = 0;
  pVVar31 = aVStack_190;
  bVar34 = true;
  VStack_180 = self;
  pSStack_168 = pSVar20;
  pCStack_160 = pCVar23;
  pOStack_158 = format;
  pCStack_150 = self_00;
  VStack_148 = VVar16;
  pcStack_140 = (code *)uVar22;
  do {
    bVar6 = bVar34;
    VVar14.constant._1_7_ = 0;
    VVar14.constant._0_1_ = (&(pCVar27->_environment)._subArch)[lVar17];
    if (3 < VVar14.constant) {
      return 3;
    }
    switch(VVar14.constant) {
    case 1:
      VVar14 = *(Value *)(&pCVar27->_cpuFeatures + lVar17 * 8);
      break;
    case 2:
      lVar28 = *(long *)(*(long *)(&pCVar27->_cpuFeatures + lVar17 * 8) + 0x20);
      if (lVar28 == 0) {
        return 0x43;
      }
      VVar14.expression =
           (Expression *)
           (*(long *)(*(long *)(&pCVar27->_cpuFeatures + lVar17 * 8) + 0x18) +
           *(long *)(lVar28 + 0x10));
      break;
    case 3:
      EVar8 = CodeHolder_evaluateExpression
                        (*(CodeHolder **)(&pCVar27->_cpuFeatures + lVar17 * 8),
                         (Expression *)&VStack_170,
                         (uint64_t *)
                         ((long)&switchD_001192a7::switchdataD_0014c3d4 +
                         (long)(int)(&switchD_001192a7::switchdataD_0014c3d4)[VVar14.constant]));
      VVar14 = VStack_170;
      if (EVar8 != 0) {
        return EVar8;
      }
    }
    pVVar31->constant = (uint64_t)VVar14;
    lVar17 = 1;
    pVVar31 = &VStack_178;
    bVar34 = false;
  } while (bVar6);
  switch((pCVar27->_environment)._arch) {
  case kUnknown:
    pEVar12 = (VStack_178.expression)->valueType + (aVStack_190[0].constant - 1);
    break;
  case k32BitMask:
    pEVar12 = (ExpressionValueType *)((long)aVStack_190[0].expression - (long)VStack_178);
    break;
  case kHost:
    pEVar12 = (ExpressionValueType *)(VStack_178.constant * aVStack_190[0].constant);
    break;
  case kRISCV32:
    pEVar19 = (ExpressionValueType *)(aVStack_190[0].constant << ((byte)VStack_178.constant & 0x3f))
    ;
    goto LAB_00119352;
  case kRISCV64:
    pEVar19 = (ExpressionValueType *)(aVStack_190[0].constant >> ((byte)VStack_178.constant & 0x3f))
    ;
LAB_00119352:
    pEVar12 = (ExpressionValueType *)0x0;
    if (VStack_178.constant < 0x40) {
      pEVar12 = pEVar19;
    }
    break;
  case kARM:
    VVar16.constant = 0x3f;
    if (VStack_178.constant < 0x3f) {
      VVar16 = VStack_178;
    }
    pEVar12 = (ExpressionValueType *)
              ((long)aVStack_190[0].constant >> ((byte)VVar16.constant & 0x3f));
    break;
  default:
    return 3;
  }
  *(ExpressionValueType **)VStack_180.expression = pEVar12;
  return 0;
}

Assistant:

ASMJIT_API Error CodeHolder::resolveUnresolvedLinks() noexcept {
  if (!hasUnresolvedLinks())
    return kErrorOk;

  Error err = kErrorOk;
  for (LabelEntry* le : labelEntries()) {
    if (!le->isBound())
      continue;

    LabelLinkIterator link(le);
    if (link) {
      Support::FastUInt8 of = 0;
      Section* toSection = le->section();
      uint64_t toOffset = Support::addOverflow(toSection->offset(), le->offset(), &of);

      do {
        uint32_t linkSectionId = link->sectionId;
        if (link->relocId == Globals::kInvalidId) {
          Section* fromSection = sectionById(linkSectionId);
          size_t linkOffset = link->offset;

          CodeBuffer& buf = _sections[linkSectionId]->buffer();
          ASMJIT_ASSERT(linkOffset < buf.size());

          // Calculate the offset relative to the start of the virtual base.
          Support::FastUInt8 localOF = of;
          uint64_t fromOffset = Support::addOverflow<uint64_t>(fromSection->offset(), linkOffset, &localOF);
          int64_t displacement = int64_t(toOffset - fromOffset + uint64_t(int64_t(link->rel)));

          if (!localOF) {
            ASMJIT_ASSERT(size_t(linkOffset) < buf.size());
            ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.valueSize());

            // Overwrite a real displacement in the CodeBuffer.
            if (CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
              link.resolveAndNext(this);
              continue;
            }
          }

          err = DebugUtils::errored(kErrorInvalidDisplacement);
          // Falls through to `link.next()`.
        }

        link.next();
      } while (link);
    }
  }

  return err;
}